

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::file::
Base<njoy::ENDFtk::file::Type<1>,std::variant<njoy::ENDFtk::section::Type<1,451>,njoy::ENDFtk::section::Type<1,452>,njoy::ENDFtk::section::Type<1,455>,njoy::ENDFtk::section::Type<1,456>,njoy::ENDFtk::section::Type<1,458>,njoy::ENDFtk::section::Type<1,460>>>
::print<std::back_insert_iterator<std::__cxx11::string>>
          (Base<njoy::ENDFtk::file::Type<1>,std::variant<njoy::ENDFtk::section::Type<1,451>,njoy::ENDFtk::section::Type<1,452>,njoy::ENDFtk::section::Type<1,455>,njoy::ENDFtk::section::Type<1,456>,njoy::ENDFtk::section::Type<1,458>,njoy::ENDFtk::section::Type<1,460>>>
           *this,back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *it,int MAT)

{
  _Rb_tree_node_base *p_Var1;
  StructureDivision SStack_68;
  
  for (p_Var1 = *(_Rb_tree_node_base **)(this + 0x18); p_Var1 != (_Rb_tree_node_base *)(this + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    Type<1>::printSection<std::back_insert_iterator<std::__cxx11::string>>
              ((SectionVariant *)&p_Var1[1]._M_parent,it,MAT,1);
  }
  fileEndRecord(&SStack_68,MAT);
  StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>(&SStack_68,it);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT ) const {

  int MF = this->MF();
  for ( const auto& entry : this->sections_ ) {

    Derived::printSection( entry.second, it, MAT, MF );
  }
  FEND( MAT ).print( it );
}